

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::UngroupedAggregateState::UngroupedAggregateState
          (UngroupedAggregateState *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *aggregate_expressions)

{
  __uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
  __p;
  const_reference this_00;
  pointer this_01;
  BoundAggregateExpression *pBVar1;
  idx_t iVar2;
  ulong __n;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> state;
  __uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
  local_50;
  vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
  *local_48;
  vector<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>,std::allocator<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>>
  *local_40;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_38;
  
  this->aggregate_expressions = aggregate_expressions;
  local_40 = (vector<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>,std::allocator<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>>
              *)&this->aggregate_data;
  local_48 = (vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
              *)&this->bind_data;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->aggregate_data).
  super_vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bind_data).
  super_vector<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  .
  super__Vector_base<duckdb::optional_ptr<duckdb::FunctionData,_true>,_std::allocator<duckdb::optional_ptr<duckdb::FunctionData,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->destructors).
  super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  .
  super__Vector_base<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts).
  super_unique_ptr<std::atomic<unsigned_long>[],_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl =
       (atomic<unsigned_long> *)0x0;
  make_uniq_array<std::atomic<unsigned_long>>
            ((duckdb *)&local_50,
             (long)(aggregate_expressions->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(aggregate_expressions->
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  __p._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl =
       local_50._M_t.
       super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
       .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl;
  local_50._M_t.
  super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
  .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl =
       (tuple<std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>)
       (_Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
        )0x0;
  ::std::
  __uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>::
  reset((__uniq_ptr_impl<std::atomic<unsigned_long>,_std::default_delete<std::atomic<unsigned_long>[]>_>
         *)&this->counts,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
                 .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl);
  ::std::
  unique_ptr<std::atomic<unsigned_long>[],_std::default_delete<std::atomic<unsigned_long>[]>_>::
  ~unique_ptr((unique_ptr<std::atomic<unsigned_long>[],_std::default_delete<std::atomic<unsigned_long>[]>_>
               *)&local_50);
  for (__n = 0; __n < (ulong)((long)(aggregate_expressions->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(aggregate_expressions->
                                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ).
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(aggregate_expressions,__n);
    this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_00);
    pBVar1 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_01->super_BaseExpression);
    iVar2 = (*(pBVar1->function).state_size)(&pBVar1->function);
    local_50._M_t.
    super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
    .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl =
         (tuple<std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>)
         operator_new__(iVar2);
    (*(pBVar1->function).initialize)
              (&pBVar1->function,
               (data_ptr_t)
               local_50._M_t.
               super__Tuple_impl<0UL,_std::atomic<unsigned_long>_*,_std::default_delete<std::atomic<unsigned_long>[]>_>
               .super__Head_base<0UL,_std::atomic<unsigned_long>_*,_false>._M_head_impl);
    ::std::
    vector<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>,std::allocator<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>>
    ::emplace_back<duckdb::unique_ptr<unsigned_char[],std::default_delete<unsigned_char>,false>>
              (local_40,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false> *)
                        &local_50);
    local_38._M_head_impl =
         (pBVar1->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    ::std::
    vector<duckdb::optional_ptr<duckdb::FunctionData,true>,std::allocator<duckdb::optional_ptr<duckdb::FunctionData,true>>>
    ::emplace_back<duckdb::optional_ptr<duckdb::FunctionData,true>>
              (local_48,(optional_ptr<duckdb::FunctionData,_true> *)&local_38);
    ::std::
    vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
    ::push_back(&(this->destructors).
                 super_vector<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long),_std::allocator<void_(*)(duckdb::Vector_&,_duckdb::AggregateInputData_&,_unsigned_long)>_>
                ,(value_type *)&(pBVar1->function).destructor);
    ::std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_50);
  }
  return;
}

Assistant:

UngroupedAggregateState::UngroupedAggregateState(const vector<unique_ptr<Expression>> &aggregate_expressions)
    : aggregate_expressions(aggregate_expressions) {
	counts = make_uniq_array<atomic<idx_t>>(aggregate_expressions.size());
	for (idx_t i = 0; i < aggregate_expressions.size(); i++) {
		auto &aggregate = aggregate_expressions[i];
		D_ASSERT(aggregate->GetExpressionClass() == ExpressionClass::BOUND_AGGREGATE);
		auto &aggr = aggregate->Cast<BoundAggregateExpression>();
		auto state = make_unsafe_uniq_array_uninitialized<data_t>(aggr.function.state_size(aggr.function));
		aggr.function.initialize(aggr.function, state.get());
		aggregate_data.push_back(std::move(state));
		bind_data.push_back(aggr.bind_info.get());
		destructors.push_back(aggr.function.destructor);
#ifdef DEBUG
		counts[i] = 0;
#endif
	}
}